

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O2

int64_t GetVirtualTransactionInputSize(CTxIn *txin,int64_t nSigOpCost,uint bytes_per_sigop)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_const_CTxIn> local_50;
  ParamsWrapper<TransactionSerParams,_const_CTxIn> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.m_params = &TX_NO_WITNESS;
  local_40.m_object = txin;
  sVar1 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>(&local_40);
  local_50.m_params = &TX_WITH_WITNESS;
  local_50.m_object = txin;
  sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTxIn_const>>(&local_50);
  sVar3 = GetSerializeSize<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    (&(txin->scriptWitness).stack);
  lVar4 = sVar3 + sVar2 + sVar1 * 3;
  lVar5 = (ulong)bytes_per_sigop * nSigOpCost;
  if (lVar5 - lVar4 != 0 && lVar4 <= lVar5) {
    lVar4 = lVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (lVar4 + 3) / 4;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetVirtualTransactionInputSize(const CTxIn& txin, int64_t nSigOpCost, unsigned int bytes_per_sigop)
{
    return GetVirtualTransactionSize(GetTransactionInputWeight(txin), nSigOpCost, bytes_per_sigop);
}